

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O1

void AdjustPusher(int tag,int magnitude,int angle,bool wind)

{
  uint uVar1;
  bool bVar2;
  uint affectee;
  uint uVar3;
  uint uVar4;
  DPusher *pDVar5;
  undefined7 in_register_00000009;
  FThinkerCollection *pFVar6;
  EPusher type;
  int iVar7;
  TArray<FThinkerCollection,_FThinkerCollection> Collection;
  FSectorTagIterator itr;
  TArray<FThinkerCollection,_FThinkerCollection> local_58;
  FThinkerIterator local_48;
  
  local_58.Array = (FThinkerCollection *)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  FThinkerIterator::FThinkerIterator(&local_48,DPusher::RegistrationInfo.MyClass,0x80);
  type = (EPusher)CONCAT71(in_register_00000009,wind) ^ p_current;
  while (pDVar5 = (DPusher *)FThinkerIterator::Next(&local_48), uVar1 = local_58.Count,
        pDVar5 != (DPusher *)0x0) {
    iVar7 = -1;
    if (pDVar5->m_Type == type) {
      bVar2 = FTagManager::SectorHasTag(&tagManager,pDVar5->m_Affectee,tag);
      iVar7 = -1;
      if (bVar2) {
        iVar7 = pDVar5->m_Affectee;
      }
    }
    if (-1 < iVar7) {
      DPusher::ChangeValues(pDVar5,magnitude,angle);
      TArray<FThinkerCollection,_FThinkerCollection>::Grow(&local_58,1);
      local_58.Array[local_58.Count].RefNum = iVar7;
      local_58.Array[local_58.Count].Obj = (DThinker *)pDVar5;
      local_58.Count = local_58.Count + 1;
    }
  }
  local_48.m_ParentType._0_4_ = tag;
  if (tag == 0) {
    local_48.m_ParentType._4_4_ = 0;
  }
  else {
    local_48.m_ParentType._4_4_ = tagManager.TagHashFirst[tag & 0xff];
  }
  do {
    affectee = FSectorTagIterator::Next((FSectorTagIterator *)&local_48);
    if ((int)affectee < 0) {
      TArray<FThinkerCollection,_FThinkerCollection>::~TArray(&local_58);
      return;
    }
    if (uVar1 == 0) {
      uVar4 = 0;
    }
    else {
      uVar3 = 0;
      pFVar6 = local_58.Array;
      do {
        uVar4 = uVar3;
        if (pFVar6->RefNum == sectors[affectee].sectornum) break;
        uVar3 = uVar3 + 1;
        pFVar6 = pFVar6 + 1;
        uVar4 = uVar1;
      } while (uVar1 != uVar3);
    }
    if (uVar4 == uVar1) {
      pDVar5 = (DPusher *)
               M_Malloc_Dbg(0x70,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                            ,0x1f7);
      DPusher::DPusher(pDVar5,type,(line_t *)0x0,magnitude,angle,(AActor *)0x0,affectee);
    }
  } while( true );
}

Assistant:

void AdjustPusher (int tag, int magnitude, int angle, bool wind)
{
	DPusher::EPusher type = wind? DPusher::p_wind : DPusher::p_current;
	
	// Find pushers already attached to the sector, and change their parameters.
	TArray<FThinkerCollection> Collection;
	{
		TThinkerIterator<DPusher> iterator;
		FThinkerCollection collect;

		while ( (collect.Obj = iterator.Next ()) )
		{
			if ((collect.RefNum = ((DPusher *)collect.Obj)->CheckForSectorMatch (type, tag)) >= 0)
			{
				((DPusher *)collect.Obj)->ChangeValues (magnitude, angle);
				Collection.Push (collect);
			}
		}
	}

	size_t numcollected = Collection.Size ();
	int secnum;

	// Now create pushers for any sectors that don't already have them.
	FSectorTagIterator itr(tag);
	while ((secnum = itr.Next()) >= 0)
	{
		unsigned int i;
		for (i = 0; i < numcollected; i++)
		{
			if (Collection[i].RefNum == sectors[secnum].sectornum)
				break;
		}
		if (i == numcollected)
		{
			new DPusher (type, NULL, magnitude, angle, NULL, secnum);
		}
	}
}